

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

void Gia_Truth6ToGiaTest(Gia_Man_t *p)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int CioId_1;
  int CioId;
  int pVarLits [6];
  int local_54;
  int iLitNew;
  int ObjId;
  int Id;
  int k;
  int i;
  int Count;
  int nCos;
  Vec_Int_t *vSupp;
  Vec_Int_t *vMap;
  word TruthNew;
  word Truth;
  Gia_Man_t *pGStack_10;
  int Size;
  Gia_Man_t *p_local;
  
  Truth._4_4_ = 5;
  pGStack_10 = p;
  iVar2 = Gia_ManCiNum(p);
  vSupp = Vec_IntStartFull(iVar2);
  _Count = Vec_IntStart(100);
  i = Gia_ManCoNum(pGStack_10);
  k = 0;
  Gia_ManHashAlloc(pGStack_10);
  Id = 0;
  while( true ) {
    iVar2 = Id;
    iVar3 = Vec_IntSize(pGStack_10->vCos);
    pGVar1 = pGStack_10;
    bVar5 = false;
    if (iVar2 < iVar3) {
      pGVar4 = Gia_ManCo(pGStack_10,Id);
      iLitNew = Gia_ObjId(pGVar1,pGVar4);
      bVar5 = iLitNew != 0;
    }
    if (!bVar5) break;
    Gia_ManCollectCis(pGStack_10,&iLitNew,1,_Count);
    iVar2 = Vec_IntSize(_Count);
    if ((iVar2 <= Truth._4_4_) && (Id < i)) {
      for (ObjId = 0; iVar2 = ObjId, iVar3 = Vec_IntSize(_Count), iVar2 < iVar3; ObjId = ObjId + 1)
      {
        iVar2 = Vec_IntEntry(_Count,ObjId);
        pGVar4 = Gia_ManObj(pGStack_10,iVar2);
        iVar3 = Gia_ObjCioId(pGVar4);
        Vec_IntWriteEntry(vSupp,iVar3,ObjId);
        iVar2 = Abc_Var2Lit(iVar2,0);
        (&CioId_1)[ObjId] = iVar2;
      }
      TruthNew = Gia_LutComputeTruth6Map(pGStack_10,Id,vSupp);
      pGVar1 = pGStack_10;
      if (Truth._4_4_ == 5) {
        iVar2 = Vec_IntSize(_Count);
        local_54 = Gia_Truth5ToGia(pGVar1,&CioId_1,iVar2,(uint)TruthNew,1);
      }
      else {
        iVar2 = Vec_IntSize(_Count);
        local_54 = Gia_Truth6ToGia(pGVar1,&CioId_1,iVar2,TruthNew,1);
      }
      Gia_ManAppendCo(pGStack_10,local_54);
      pGVar1 = pGStack_10;
      iVar2 = Gia_ManCoNum(pGStack_10);
      vMap = (Vec_Int_t *)Gia_LutComputeTruth6Map(pGVar1,iVar2 + -1,vSupp);
      for (ObjId = 0; iVar2 = ObjId, iVar3 = Vec_IntSize(_Count), iVar2 < iVar3; ObjId = ObjId + 1)
      {
        iVar2 = Vec_IntEntry(_Count,ObjId);
        pGVar4 = Gia_ManObj(pGStack_10,iVar2);
        iVar2 = Gia_ObjCioId(pGVar4);
        Vec_IntWriteEntry(vSupp,iVar2,-1);
      }
      if ((Vec_Int_t *)TruthNew != vMap) {
        printf("Error for output %d.\n",(ulong)(uint)Id);
      }
      k = k + 1;
    }
    Id = Id + 1;
  }
  Gia_ManHashStop(pGStack_10);
  printf("Finished processing %d outputs.\n",(ulong)(uint)k);
  Vec_IntFree(_Count);
  Vec_IntFree(vSupp);
  return;
}

Assistant:

void Gia_Truth6ToGiaTest( Gia_Man_t * p )
{
    int Size = 5;
    word Truth, TruthNew;
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManCiNum(p) );
    Vec_Int_t * vSupp = Vec_IntStart( 100 );
    int nCos = Gia_ManCoNum(p), Count = 0;
    int i, k, Id, ObjId, iLitNew;
    Gia_ManHashAlloc( p );
    Gia_ManForEachCoId( p, Id, i )
    {
        Gia_ManCollectCis( p, &Id, 1, vSupp ); // ObjIds
        if ( Vec_IntSize(vSupp) <= Size && i < nCos )
        {
            int pVarLits[6];
            Vec_IntForEachEntry( vSupp, ObjId, k )
            {
                int CioId = Gia_ObjCioId(Gia_ManObj(p, ObjId));
                Vec_IntWriteEntry( vMap, CioId, k );
                pVarLits[k] = Abc_Var2Lit( ObjId, 0 );
            }
            Truth = Gia_LutComputeTruth6Map( p, i, vMap );
            if ( Size == 5 )
                iLitNew = Gia_Truth5ToGia( p, pVarLits, Vec_IntSize(vSupp), (unsigned)Truth, 1 );
            else
                iLitNew = Gia_Truth6ToGia( p, pVarLits, Vec_IntSize(vSupp), Truth, 1 );
            Gia_ManAppendCo( p, iLitNew );
            TruthNew = Gia_LutComputeTruth6Map( p, Gia_ManCoNum(p)-1, vMap );
            Vec_IntForEachEntry( vSupp, ObjId, k )
            {
                int CioId = Gia_ObjCioId(Gia_ManObj(p, ObjId));
                Vec_IntWriteEntry( vMap, CioId, -1 );
            }
            if ( Truth != TruthNew )
                printf( "Error for output %d.\n", i );
            Count++;
            //Dau_DsdPrintFromTruth( &Truth, Vec_IntSize(vSupp) );
        }
    }
    Gia_ManHashStop( p );
    printf( "Finished processing %d outputs.\n", Count );
    Vec_IntFree( vSupp );
    Vec_IntFree( vMap );
}